

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O0

json * __thiscall
argo::json::insert(json *this,string *name,
                  unique_ptr<argo::json,_std::default_delete<argo::json>_> *j)

{
  json_exception *this_00;
  char *json_type_name;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> local_30;
  pointer local_28;
  json *r;
  unique_ptr<argo::json,_std::default_delete<argo::json>_> *j_local;
  string *name_local;
  json *this_local;
  
  r = (json *)j;
  j_local = (unique_ptr<argo::json,_std::default_delete<argo::json>_> *)name;
  name_local = (string *)this;
  if (this->m_type == object_e) {
    local_28 = std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::release(j);
    std::unique_ptr<argo::json,std::default_delete<argo::json>>::
    unique_ptr<std::default_delete<argo::json>,void>
              ((unique_ptr<argo::json,std::default_delete<argo::json>> *)&local_30,local_28);
    std::
    map<std::__cxx11::string,std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>>>
    ::
    emplace<std::__cxx11::string_const&,std::unique_ptr<argo::json,std::default_delete<argo::json>>>
              ((map<std::__cxx11::string,std::unique_ptr<argo::json,std::default_delete<argo::json>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::unique_ptr<argo::json,std::default_delete<argo::json>>>>>
                *)&(this->m_value).u_object,name,&local_30);
    std::unique_ptr<argo::json,_std::default_delete<argo::json>_>::~unique_ptr(&local_30);
    return local_28;
  }
  this_00 = (json_exception *)__cxa_allocate_exception(0xd8);
  json_type_name = get_instance_type_name(this);
  json_exception::json_exception(this_00,not_an_object_e,json_type_name);
  __cxa_throw(this_00,&json_exception::typeinfo,json_exception::~json_exception);
}

Assistant:

const json &json::insert(const string &name, unique_ptr<json> j)
{
    if (m_type == object_e)
    {
        json *r;
        m_value.u_object.emplace(name, unique_ptr<json>(r = j.release()));
        return *r;
    }
    else
    {
        throw json_exception(json_exception::not_an_object_e, get_instance_type_name());
    }
}